

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_history.c
# Opt level: O3

void fsg_history_entry_add
               (fsg_history_t *h,fsg_link_t *link,int32 frame,int32 score,int32 pred,int32 lc,
               fsg_pnode_ctxt_t rc)

{
  void *ptr;
  int iVar1;
  undefined8 *puVar2;
  gnode_s *pgVar3;
  glist_t pgVar4;
  long lVar5;
  gnode_t *pgVar6;
  gnode_t *gn;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  undefined1 auVar11 [16];
  uint in_stack_00000018;
  uint in_stack_0000001c;
  
  if (frame < 0) {
    puVar2 = (undefined8 *)
             __ckd_calloc__(1,0x28,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                            ,0x92);
    *puVar2 = link;
    *(int32 *)(puVar2 + 2) = frame;
    *(int32 *)(puVar2 + 1) = score;
    *(int32 *)((long)puVar2 + 0xc) = pred;
    *(short *)((long)puVar2 + 0x14) = (short)lc;
    puVar2[3] = rc.bv._0_8_;
    puVar2[4] = rc.bv._8_8_;
    blkarray_list_append(h->entries,puVar2);
    return;
  }
  iVar1 = link->to_state;
  gn = h->frame_entries[iVar1][lc];
  if (gn == (gnode_t *)0x0) {
    pgVar6 = (gnode_t *)0x0;
    gn = (gnode_t *)0x0;
  }
  else {
    uVar7 = rc.bv._4_8_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar7;
    lVar5 = (gn->data).i;
    if (*(int *)(lVar5 + 8) < score) {
      pgVar6 = (gnode_t *)0x0;
    }
    else {
      do {
        pgVar6 = gn;
        rc.bv[0] = ~*(uint *)(lVar5 + 0x18) & rc.bv[0];
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(lVar5 + 0x1c);
        auVar8 = ~auVar9 & auVar8;
        uVar7 = auVar8._0_8_;
        rc.bv[3] = ~*(uint *)(lVar5 + 0x24) & rc.bv[3];
        if (((auVar8._0_4_ == 0 && rc.bv[0] == 0) && auVar8._4_4_ == 0) && rc.bv[3] == 0) {
          return;
        }
        gn = pgVar6->next;
        if (gn == (gnode_s *)0x0) {
          gn = (gnode_t *)0x0;
          break;
        }
        lVar5 = (gn->data).i;
      } while (score <= *(int *)(lVar5 + 8));
    }
    rc.bv[1] = (uint32)uVar7;
    rc.bv[2] = (uint32)(uVar7 >> 0x20);
  }
  puVar2 = (undefined8 *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                          ,0xb1);
  *puVar2 = link;
  *(int32 *)(puVar2 + 2) = frame;
  *(int32 *)(puVar2 + 1) = score;
  *(int32 *)((long)puVar2 + 0xc) = pred;
  *(short *)((long)puVar2 + 0x14) = (short)lc;
  puVar2[3] = CONCAT44(rc.bv[1],rc.bv[0]);
  puVar2[4] = CONCAT44(rc.bv[3],rc.bv[2]);
  if (pgVar6 == (gnode_t *)0x0) {
    pgVar4 = glist_add_ptr(h->frame_entries[iVar1][lc],puVar2);
    h->frame_entries[iVar1][lc] = pgVar4;
    pgVar3 = (gnode_s *)h->frame_entries[iVar1];
    pgVar6 = (gnode_t *)(&pgVar3->data)[lc].ptr;
  }
  else {
    pgVar3 = glist_insert_ptr(pgVar6,puVar2);
    pgVar6 = pgVar3;
  }
  while (gn != (gnode_t *)0x0) {
    ptr = (gn->data).ptr;
    uVar10 = ~rc.bv[0] & *(uint *)((long)ptr + 0x18);
    uVar12 = ~rc.bv[1] & *(uint *)((long)ptr + 0x1c);
    uVar13 = ~in_stack_00000018 & *(uint *)((long)ptr + 0x20);
    uVar14 = ~in_stack_0000001c & *(uint *)((long)ptr + 0x24);
    *(uint *)((long)ptr + 0x18) = uVar10;
    *(uint *)((long)ptr + 0x1c) = uVar12;
    *(uint *)((long)ptr + 0x20) = uVar13;
    *(uint *)((long)ptr + 0x24) = uVar14;
    auVar11._0_4_ = -(uint)(uVar10 == 0);
    auVar11._4_4_ = -(uint)(uVar12 == 0);
    auVar11._8_4_ = -(uint)(uVar13 == 0);
    auVar11._12_4_ = -(uint)(uVar14 == 0);
    iVar1 = movmskps((int)pgVar3,auVar11);
    if (iVar1 == 0xf) {
      ckd_free(ptr);
      pgVar3 = gnode_free(gn,pgVar6);
      gn = pgVar3;
    }
    else {
      pgVar3 = gn->next;
      pgVar6 = gn;
      gn = pgVar3;
    }
  }
  return;
}

Assistant:

void
fsg_history_entry_add(fsg_history_t * h,
                      fsg_link_t * link,
                      int32 frame, int32 score, int32 pred,
                      int32 lc, fsg_pnode_ctxt_t rc)
{
    fsg_hist_entry_t *entry, *new_entry;
    int32 s;
    gnode_t *gn, *prev_gn;

    /* Skip the optimization for the initial dummy entries; always enter them */
    if (frame < 0) {
        new_entry =
            (fsg_hist_entry_t *) ckd_calloc(1, sizeof(fsg_hist_entry_t));
        new_entry->fsglink = link;
        new_entry->frame = frame;
        new_entry->score = score;
        new_entry->pred = pred;
        new_entry->lc = lc;
        new_entry->rc = rc;

        blkarray_list_append(h->entries, (void *) new_entry);
        return;
    }

    s = fsg_link_to_state(link);

    /* Locate where this entry should be inserted in frame_entries[s][lc] */
    prev_gn = NULL;
    for (gn = h->frame_entries[s][lc]; gn; gn = gnode_next(gn)) {
        entry = (fsg_hist_entry_t *) gnode_ptr(gn);

        if (score BETTER_THAN entry->score)
            break;              /* Found where to insert new entry */

        /* Existing entry score not worse than new score */
        if (FSG_PNODE_CTXT_SUB(&rc, &(entry->rc)) == 0)
            return;             /* rc set reduced to 0; new entry can be ignored */

        prev_gn = gn;
    }

    /* Create new entry after prev_gn (if prev_gn is NULL, at head) */
    new_entry =
        (fsg_hist_entry_t *) ckd_calloc(1, sizeof(fsg_hist_entry_t));
    new_entry->fsglink = link;
    new_entry->frame = frame;
    new_entry->score = score;
    new_entry->pred = pred;
    new_entry->lc = lc;
    new_entry->rc = rc;         /* Note: rc set must be non-empty at this point */

    if (!prev_gn) {
        h->frame_entries[s][lc] = glist_add_ptr(h->frame_entries[s][lc],
                                                (void *) new_entry);
        prev_gn = h->frame_entries[s][lc];
    }
    else
        prev_gn = glist_insert_ptr(prev_gn, (void *) new_entry);

    /*
     * Update the rc set of all the remaining entries in the list.  At this
     * point, gn is the entry, if any, immediately following new entry.
     */
    while (gn) {
        entry = (fsg_hist_entry_t *) gnode_ptr(gn);

        if (FSG_PNODE_CTXT_SUB(&(entry->rc), &rc) == 0) {
            /* rc set of entry reduced to 0; can prune this entry */
            ckd_free((void *) entry);
            gn = gnode_free(gn, prev_gn);
        }
        else {
            prev_gn = gn;
            gn = gnode_next(gn);
        }
    }
}